

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

void __thiscall embree::FileName::FileName(FileName *this,char *in)

{
  char cVar1;
  pointer pcVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)this);
  for (uVar3 = 0; uVar4 = (this->filename)._M_string_length, uVar3 < uVar4; uVar3 = uVar3 + 1) {
    pcVar2 = (this->filename)._M_dataplus._M_p;
    cVar1 = pcVar2[uVar3];
    if ((cVar1 == '\\') || (cVar1 == '/')) {
      pcVar2[uVar3] = '/';
    }
  }
  while ((uVar4 != 0 && ((this->filename)._M_dataplus._M_p[uVar4 - 1] == '/'))) {
    std::__cxx11::string::resize((ulong)this);
    uVar4 = (this->filename)._M_string_length;
  }
  return;
}

Assistant:

FileName::FileName (const char* in) {
    filename = in;
    for (size_t i=0; i<filename.size(); i++)
      if (filename[i] == '\\' || filename[i] == '/')
        filename[i] = path_sep;
    while (!filename.empty() && filename[filename.size()-1] == path_sep)
      filename.resize(filename.size()-1);
  }